

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Keyboard.cpp
# Opt level: O0

bool __thiscall
Inputs::Keyboard::set_key_pressed(Keyboard *this,Key key,char param_2,bool is_pressed,bool param_4)

{
  byte bVar1;
  int iVar2;
  size_type sVar3;
  reference local_38;
  ulong local_28;
  size_t key_offset;
  bool param_4_local;
  bool is_pressed_local;
  char param_2_local;
  Keyboard *pKStack_18;
  Key key_local;
  Keyboard *this_local;
  
  local_28 = (long)(int)key;
  key_offset._1_1_ = param_4;
  key_offset._2_1_ = is_pressed;
  key_offset._3_1_ = param_2;
  key_offset._4_4_ = key;
  pKStack_18 = this;
  sVar3 = std::vector<bool,_std::allocator<bool>_>::size(&this->key_states_);
  if (sVar3 <= (ulong)(long)(int)key) {
    std::vector<bool,_std::allocator<bool>_>::resize(&this->key_states_,local_28 + 1,false);
  }
  bVar1 = key_offset._2_1_;
  local_38 = std::vector<bool,_std::allocator<bool>_>::operator[](&this->key_states_,local_28);
  std::_Bit_reference::operator=(&local_38,(bool)(bVar1 & 1));
  if (this->delegate_ == (Delegate *)0x0) {
    this_local._7_1_ = false;
  }
  else {
    iVar2 = (**this->delegate_->_vptr_Delegate)
                      (this->delegate_,this,(ulong)key_offset._4_4_,(ulong)(key_offset._2_1_ & 1));
    this_local._7_1_ = (bool)((byte)iVar2 & 1);
  }
  return this_local._7_1_;
}

Assistant:

bool Keyboard::set_key_pressed(Key key, char, bool is_pressed, bool) {
	const size_t key_offset = size_t(key);
	if(key_offset >= key_states_.size()) {
		key_states_.resize(key_offset+1, false);
	}
	key_states_[key_offset] = is_pressed;

	if(delegate_) return delegate_->keyboard_did_change_key(this, key, is_pressed);
	return false;
}